

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# capnp.c++
# Opt level: O3

Maybe<const_kj::ReadableDirectory_&> __thiscall
capnp::compiler::CompilerMain::getSourceDirectory
          (CompilerMain *this,StringPtr pathStr,bool isSourcePrefix)

{
  HashMap<kj::Path,_capnp::compiler::CompilerMain::SourceDirectory> *this_00;
  PathPtr other;
  size_t sVar1;
  ReadableDirectory *pRVar2;
  bool bVar3;
  int iVar4;
  undefined4 extraout_var;
  Maybe<capnp::compiler::CompilerMain::SourceDirectory_&> MVar5;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  ulong size;
  size_t extraout_RDX;
  String *key;
  char *pcVar6;
  String *pSVar7;
  size_t __n;
  String prefix;
  Path path;
  PathPtr cwd;
  String local_108;
  Path local_e8;
  SourceDirectory local_c8;
  SourceDirectory local_b0;
  String local_98;
  Path local_78;
  Path local_58;
  PathPtr local_40;
  
  size = pathStr.content.size_;
  pcVar6 = pathStr.content.ptr;
  iVar4 = (*((this->disk).ptr)->_vptr_Filesystem[2])();
  local_40.parts.ptr = (String *)CONCAT44(extraout_var,iVar4);
  local_40.parts.size_ = extraout_RDX;
  kj::PathPtr::eval(&local_e8,&local_40,pathStr);
  if ((String *)local_e8.parts.size_ == (String *)0x0) {
    iVar4 = (**((this->disk).ptr)->_vptr_Filesystem)();
    key = (String *)CONCAT44(extraout_var_00,iVar4);
  }
  else {
    this_00 = &this->sourceDirectories;
    MVar5 = kj::HashMap<kj::Path,capnp::compiler::CompilerMain::SourceDirectory>::find<kj::Path&>
                      ((HashMap<kj::Path,capnp::compiler::CompilerMain::SourceDirectory> *)this_00,
                       &local_e8);
    if (MVar5.ptr == (SourceDirectory *)0x0) {
      other.parts.size_ = local_40.parts.size_;
      other.parts.ptr = local_40.parts.ptr;
      local_108.content.ptr = (char *)local_e8.parts.ptr;
      local_108.content.size_ = local_e8.parts.size_;
      bVar3 = kj::PathPtr::operator==((PathPtr *)&local_108,other);
      if (bVar3) {
        iVar4 = (*((this->disk).ptr)->_vptr_Filesystem[1])();
        key = (String *)CONCAT44(extraout_var_01,iVar4);
        if (isSourcePrefix) {
          local_58.parts.ptr = local_e8.parts.ptr;
          local_58.parts.size_ = local_e8.parts.size_;
          local_58.parts.disposer = local_e8.parts.disposer;
          local_e8.parts.ptr = (String *)0x0;
          local_e8.parts.size_ = 0;
          local_b0.dir.disposer = (Disposer *)&kj::NullDisposer::instance;
          local_b0.dir.ptr = (ReadableDirectory *)key;
          local_b0.isSourcePrefix = isSourcePrefix;
          kj::HashMap<kj::Path,_capnp::compiler::CompilerMain::SourceDirectory>::insert
                    (this_00,&local_58,&local_b0);
          pRVar2 = local_b0.dir.ptr;
          if ((String *)local_b0.dir.ptr != (String *)0x0) {
            local_b0.dir.ptr = (ReadableDirectory *)0x0;
            (**(local_b0.dir.disposer)->_vptr_Disposer)
                      (local_b0.dir.disposer,
                       *(_func_int **)((long)((Array<char> *)&pRVar2->super_FsNode)->ptr + -0x10) +
                       (long)&pRVar2->super_FsNode);
          }
          sVar1 = local_58.parts.size_;
          pSVar7 = local_58.parts.ptr;
          if (local_58.parts.ptr != (String *)0x0) {
            local_58.parts.ptr = (String *)0x0;
            local_58.parts.size_ = 0;
            (**(local_58.parts.disposer)->_vptr_ArrayDisposer)
                      (local_58.parts.disposer,pSVar7,0x18,sVar1,sVar1,
                       kj::ArrayDisposer::Dispose_<kj::String,_false>::destruct);
          }
        }
      }
      else {
        iVar4 = (**((this->disk).ptr)->_vptr_Filesystem)();
        (**(code **)(*(long *)CONCAT44(extraout_var_02,iVar4) + 0x58))
                  (&local_108,(long *)CONCAT44(extraout_var_02,iVar4),local_e8.parts.ptr,
                   local_e8.parts.size_);
        key = (String *)local_108.content.size_;
        if ((String *)local_108.content.size_ == (String *)0x0) {
          key = (String *)0x0;
        }
        else {
          local_78.parts.ptr = local_e8.parts.ptr;
          local_78.parts.size_ = local_e8.parts.size_;
          local_78.parts.disposer = local_e8.parts.disposer;
          local_e8.parts.ptr = (String *)0x0;
          local_e8.parts.size_ = 0;
          local_c8.dir.disposer = (Disposer *)local_108.content.ptr;
          local_c8.dir.ptr = (ReadableDirectory *)local_108.content.size_;
          local_c8.isSourcePrefix = isSourcePrefix;
          kj::HashMap<kj::Path,_capnp::compiler::CompilerMain::SourceDirectory>::insert
                    (this_00,&local_78,&local_c8);
          pRVar2 = local_c8.dir.ptr;
          if ((String *)local_c8.dir.ptr != (String *)0x0) {
            local_c8.dir.ptr = (ReadableDirectory *)0x0;
            (**(_func_int **)((Array<char> *)&(local_c8.dir.disposer)->_vptr_Disposer)->ptr)
                      (local_c8.dir.disposer,
                       *(_func_int **)((long)((Array<char> *)&pRVar2->super_FsNode)->ptr + -0x10) +
                       (long)&pRVar2->super_FsNode);
          }
          sVar1 = local_78.parts.size_;
          pSVar7 = local_78.parts.ptr;
          if (local_78.parts.ptr != (String *)0x0) {
            local_78.parts.ptr = (String *)0x0;
            local_78.parts.size_ = 0;
            (**(local_78.parts.disposer)->_vptr_ArrayDisposer)
                      (local_78.parts.disposer,pSVar7,0x18,sVar1,sVar1,
                       kj::ArrayDisposer::Dispose_<kj::String,_false>::destruct);
          }
          if ((size < 2) || (pcVar6[size - 2] != '/')) {
            kj::heapString(&local_108,size);
            __n = size - 1;
            pSVar7 = (String *)local_108.content.size_;
            if ((String *)local_108.content.size_ != (String *)0x0) {
              pSVar7 = (String *)local_108.content.ptr;
            }
            if (__n != 0) {
              memcpy(pSVar7,pcVar6,__n);
              pSVar7 = (String *)((long)pSVar7 + __n);
            }
            *(undefined1 *)&(pSVar7->content).ptr = 0x2f;
          }
          else {
            kj::heapString(&local_108,size - 1);
            pSVar7 = (String *)local_108.content.size_;
            if ((String *)local_108.content.size_ != (String *)0x0) {
              pSVar7 = (String *)local_108.content.ptr;
            }
            memcpy(pSVar7,pcVar6,size - 1);
          }
          local_98.content.ptr = local_108.content.ptr;
          local_98.content.size_ = local_108.content.size_;
          local_98.content.disposer = local_108.content.disposer;
          local_108.content.ptr = (char *)0x0;
          local_108.content.size_ = 0;
          kj::HashMap<const_kj::ReadableDirectory_*,_kj::String>::insert
                    (&this->dirPrefixes,(ReadableDirectory *)key,&local_98);
          sVar1 = local_98.content.size_;
          pcVar6 = local_98.content.ptr;
          if ((String *)local_98.content.ptr != (String *)0x0) {
            local_98.content.ptr = (char *)0x0;
            local_98.content.size_ = 0;
            (**(local_98.content.disposer)->_vptr_ArrayDisposer)
                      (local_98.content.disposer,pcVar6,1,sVar1,sVar1,0);
          }
          sVar1 = local_108.content.size_;
          pcVar6 = local_108.content.ptr;
          if ((String *)local_108.content.ptr != (String *)0x0) {
            local_108.content.ptr = (char *)0x0;
            local_108.content.size_ = 0;
            (**(local_108.content.disposer)->_vptr_ArrayDisposer)
                      (local_108.content.disposer,pcVar6,1,sVar1,sVar1,0);
          }
        }
      }
    }
    else {
      (MVar5.ptr)->isSourcePrefix = (bool)((MVar5.ptr)->isSourcePrefix | isSourcePrefix);
      key = (String *)((MVar5.ptr)->dir).ptr;
    }
  }
  sVar1 = local_e8.parts.size_;
  pSVar7 = local_e8.parts.ptr;
  if (local_e8.parts.ptr != (String *)0x0) {
    local_e8.parts.ptr = (String *)0x0;
    local_e8.parts.size_ = 0;
    (**(local_e8.parts.disposer)->_vptr_ArrayDisposer)
              (local_e8.parts.disposer,pSVar7,0x18,sVar1,sVar1,
               kj::ArrayDisposer::Dispose_<kj::String,_false>::destruct);
  }
  return (Maybe<const_kj::ReadableDirectory_&>)(ReadableDirectory *)key;
}

Assistant:

kj::Maybe<const kj::ReadableDirectory&> getSourceDirectory(
      kj::StringPtr pathStr, bool isSourcePrefix) {
    auto cwd = disk->getCurrentPath();
    auto path = cwd.evalNative(pathStr);

    if (path.size() == 0) return disk->getRoot();

    KJ_IF_MAYBE(sdir, sourceDirectories.find(path)) {
      sdir->isSourcePrefix = sdir->isSourcePrefix || isSourcePrefix;
      return *sdir->dir;
    }

    if (path == cwd) {
      // Slight hack if the working directory is explicitly specified:
      // - We want to avoid opening a new copy of the working directory, as tryOpenSubdir() would
      //   do.
      // - If isSourcePrefix is true, we need to add it to sourceDirectories to track that.
      //   Otherwise we don't need to add it at all.
      // - We do not need to add it to dirPrefixes since the cwd is already handled in
      //   getDisplayName().
      auto& result = disk->getCurrent();
      if (isSourcePrefix) {
        kj::Own<const kj::ReadableDirectory> fakeOwn(&result, kj::NullDisposer::instance);
        sourceDirectories.insert(kj::mv(path), { kj::mv(fakeOwn), isSourcePrefix });
      }
      return result;
    }

    KJ_IF_MAYBE(dir, disk->getRoot().tryOpenSubdir(path)) {
      auto& result = *dir->get();
      sourceDirectories.insert(kj::mv(path), { kj::mv(*dir), isSourcePrefix });
#if _WIN32
      kj::String prefix = pathStr.endsWith("/") || pathStr.endsWith("\\")
                        ? kj::str(pathStr) : kj::str(pathStr, '\\');
#else
      kj::String prefix = pathStr.endsWith("/") ? kj::str(pathStr) : kj::str(pathStr, '/');
#endif
      dirPrefixes.insert(&result, kj::mv(prefix));
      return result;
    } else {
      return nullptr;
    }
  }